

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uitercollationiterator.cpp
# Opt level: O0

UBool __thiscall
icu_63::FCDUIterCollationIterator::previousSegment
          (FCDUIterCollationIterator *this,UErrorCode *errorCode)

{
  int iVar1;
  UCharIterator *pUVar2;
  UCharIteratorMove *pUVar3;
  UBool UVar4;
  byte bVar5;
  int32_t iVar6;
  UChar32 UVar7;
  ushort local_76;
  uint8_t trailCC;
  uint16_t fcd16;
  byte local_61;
  UChar32 c;
  uint8_t nextCC;
  UnicodeString s;
  UErrorCode *errorCode_local;
  FCDUIterCollationIterator *this_local;
  
  s.fUnion._48_8_ = errorCode;
  UVar4 = ::U_FAILURE(*errorCode);
  if (UVar4 != '\0') {
    return '\0';
  }
  iVar6 = (*((this->super_UIterCollationIterator).iter)->getIndex)
                    ((this->super_UIterCollationIterator).iter,UITER_CURRENT);
  this->pos = iVar6;
  UnicodeString::UnicodeString((UnicodeString *)&c);
  local_61 = 0;
  do {
    UVar7 = uiter_previous32_63((this->super_UIterCollationIterator).iter);
    if (UVar7 < 0) break;
    local_76 = Normalizer2Impl::getFCD16(this->nfcImpl,UVar7);
    bVar5 = (byte)local_76;
    if ((bVar5 == 0) && (UVar4 = UnicodeString::isEmpty((UnicodeString *)&c), UVar4 == '\0')) {
      uiter_next32_63((this->super_UIterCollationIterator).iter);
      break;
    }
    UnicodeString::append((UnicodeString *)&c,UVar7);
    if ((bVar5 != 0) &&
       (((local_61 != 0 && (local_61 < bVar5)) ||
        (UVar4 = CollationFCD::isFCD16OfTibetanCompositeVowel(local_76), UVar4 != '\0'))))
    goto LAB_00290df9;
    local_61 = (byte)(local_76 >> 8);
  } while (local_61 != 0);
  iVar1 = this->pos;
  iVar6 = UnicodeString::length((UnicodeString *)&c);
  this->start = iVar1 - iVar6;
  pUVar2 = (this->super_UIterCollationIterator).iter;
  pUVar3 = pUVar2->move;
  iVar6 = UnicodeString::length((UnicodeString *)&c);
  (*pUVar3)(pUVar2,iVar6,UITER_CURRENT);
  this->state = ITER_IN_FCD_SEGMENT;
  this_local._7_1_ = '\x01';
  goto LAB_00290ffc;
LAB_00290df9:
  if ((local_76 < 0x100) ||
     (UVar7 = uiter_previous32_63((this->super_UIterCollationIterator).iter), UVar7 < 0))
  goto LAB_00290e88;
  local_76 = Normalizer2Impl::getFCD16(this->nfcImpl,UVar7);
  if (local_76 != 0) {
    UnicodeString::append((UnicodeString *)&c,UVar7);
    goto LAB_00290df9;
  }
  uiter_next32_63((this->super_UIterCollationIterator).iter);
LAB_00290e88:
  UnicodeString::reverse((UnicodeString *)&c);
  UVar4 = normalize(this,(UnicodeString *)&c,(UErrorCode *)s.fUnion._48_8_);
  if (UVar4 == '\0') {
    this_local._7_1_ = '\0';
  }
  else {
    this->limit = this->pos;
    iVar1 = this->pos;
    iVar6 = UnicodeString::length((UnicodeString *)&c);
    this->start = iVar1 - iVar6;
    this->state = IN_NORM_ITER_AT_START;
    iVar6 = UnicodeString::length(&this->normalized);
    this->pos = iVar6;
    this_local._7_1_ = '\x01';
  }
LAB_00290ffc:
  UnicodeString::~UnicodeString((UnicodeString *)&c);
  return this_local._7_1_;
}

Assistant:

UBool
FCDUIterCollationIterator::previousSegment(UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return FALSE; }
    U_ASSERT(state == ITER_CHECK_BWD);
    // The input text [(iter index)..limit[ passes the FCD check.
    pos = iter.getIndex(&iter, UITER_CURRENT);
    // Collect the characters being checked, in case they need to be normalized.
    UnicodeString s;
    uint8_t nextCC = 0;
    for(;;) {
        // Fetch the previous character and its fcd16 value.
        UChar32 c = uiter_previous32(&iter);
        if(c < 0) { break; }
        uint16_t fcd16 = nfcImpl.getFCD16(c);
        uint8_t trailCC = (uint8_t)fcd16;
        if(trailCC == 0 && !s.isEmpty()) {
            // FCD boundary after this character.
            uiter_next32(&iter);
            break;
        }
        s.append(c);
        if(trailCC != 0 && ((nextCC != 0 && trailCC > nextCC) ||
                            CollationFCD::isFCD16OfTibetanCompositeVowel(fcd16))) {
            // Fails FCD check. Find the previous FCD boundary and normalize.
            while(fcd16 > 0xff) {
                c = uiter_previous32(&iter);
                if(c < 0) { break; }
                fcd16 = nfcImpl.getFCD16(c);
                if(fcd16 == 0) {
                    (void)uiter_next32(&iter);
                    break;
                }
                s.append(c);
            }
            s.reverse();
            if(!normalize(s, errorCode)) { return FALSE; }
            limit = pos;
            start = pos - s.length();
            state = IN_NORM_ITER_AT_START;
            pos = normalized.length();
            return TRUE;
        }
        nextCC = (uint8_t)(fcd16 >> 8);
        if(nextCC == 0) {
            // FCD boundary before the following character.
            break;
        }
    }
    start = pos - s.length();
    U_ASSERT(pos != start);
    iter.move(&iter, s.length(), UITER_CURRENT);
    state = ITER_IN_FCD_SEGMENT;
    return TRUE;
}